

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleManager.h
# Opt level: O3

void __thiscall Scine::Core::ModuleManager::Impl::tryLoadModulesInPath(Impl *this,path *directory)

{
  directory_iterator end;
  directory_iterator local_30;
  _Alloc_hider local_28;
  directory_iterator local_20;
  
  boost::filesystem::detail::status((path *)&local_28,(error_code *)directory);
  if ((int)local_28._M_p == 3) {
    local_28._M_p = (pointer)0x0;
    boost::filesystem::directory_iterator::directory_iterator(&local_30,directory,none);
    local_20.m_imp.px = (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)(dir_itr_imp *)0x0;
    std::
    for_each<boost::filesystem::directory_iterator,Scine::Core::ModuleManager::Impl::tryLoadModulesInPath(boost::filesystem::path_const&)::_lambda(auto:1_const&)_1_>
              (&local_30,&local_20,(anon_class_8_1_8991fb9c)this);
    boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_20.m_imp);
    boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_30.m_imp);
    boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr
              ((intrusive_ptr<boost::filesystem::detail::dir_itr_imp> *)&local_28);
  }
  return;
}

Assistant:

void tryLoadModulesInPath(const boost::filesystem::path& directory) {
    if (!boost::filesystem::is_directory(directory)) {
      return;
    }

    const boost::filesystem::directory_iterator end;
    std::for_each(boost::filesystem::directory_iterator(directory), end, [&](const auto& filePath) {
      if (patternMatchModuleLibrary(filePath.path().filename().string())) {
        try {
          this->load(filePath);
        }
        catch (...) {
        }
      }
    });
  }